

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O1

void __thiscall
Imf_3_2::Image::resize
          (Image *this,Box2i *dataWindow,LevelMode levelMode,LevelRoundingMode levelRoundingMode)

{
  ImageLevel **ppIVar1;
  ImageLevel *pIVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ImageLevel **ppIVar6;
  undefined4 extraout_var;
  _Rb_tree_node_base *p_Var7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  Box2i levelDataWindow;
  uint local_60;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  ulong local_40;
  Box2i *local_38;
  
  clearLevels(this);
  if (levelMode == RIPMAP_LEVELS) {
    iVar3 = ((dataWindow->max).x - (dataWindow->min).x) + 1;
LAB_0011c372:
    iVar3 = anon_unknown_8::roundLog2(iVar3,levelRoundingMode);
    local_60 = iVar3 + 1;
  }
  else {
    if (levelMode == MIPMAP_LEVELS) {
      iVar8 = ((dataWindow->max).x - (dataWindow->min).x) + 1;
      iVar3 = ((dataWindow->max).y - (dataWindow->min).y) + 1;
      if (iVar3 < iVar8) {
        iVar3 = iVar8;
      }
      goto LAB_0011c372;
    }
    local_60 = 0;
    if (levelMode == ONE_LEVEL) {
      local_60 = 1;
    }
  }
  if (levelMode == RIPMAP_LEVELS) {
    iVar3 = ((dataWindow->max).y - (dataWindow->min).y) + 1;
  }
  else {
    if (levelMode != MIPMAP_LEVELS) {
      iVar3 = 0;
      if (levelMode == ONE_LEVEL) {
        iVar3 = 1;
      }
      goto LAB_0011c3c7;
    }
    iVar8 = ((dataWindow->max).x - (dataWindow->min).x) + 1;
    iVar3 = ((dataWindow->max).y - (dataWindow->min).y) + 1;
    if (iVar3 < iVar8) {
      iVar3 = iVar8;
    }
  }
  iVar3 = anon_unknown_8::roundLog2(iVar3,levelRoundingMode);
  iVar3 = iVar3 + 1;
LAB_0011c3c7:
  uVar4 = (ulong)iVar3;
  uVar5 = uVar4 * (long)(int)local_60;
  ppIVar6 = (ImageLevel **)operator_new__(-(ulong)(uVar5 >> 0x3d != 0) | uVar5 * 8);
  ppIVar1 = (this->_levels)._data;
  if (ppIVar1 != (ImageLevel **)0x0) {
    operator_delete__(ppIVar1);
  }
  (this->_levels)._sizeX = uVar4;
  (this->_levels)._sizeY = (long)(int)local_60;
  (this->_levels)._data = ppIVar6;
  if (0 < iVar3) {
    uVar5 = (ulong)local_60;
    uVar10 = 0;
    local_40 = uVar5;
    local_38 = dataWindow;
    do {
      if (0 < (int)local_60) {
        uVar9 = 0;
        do {
          if (uVar9 == uVar10 || levelMode != MIPMAP_LEVELS) {
            local_50 = (dataWindow->min).x;
            iVar3 = (dataWindow->max).x;
            local_44 = -1;
            local_48 = -1;
            iVar8 = iVar3 - local_50;
            if (local_50 <= iVar3) {
              local_48 = (iVar8 + 1) / (1 << ((byte)uVar9 & 0x1f));
              local_48 = (uint)(local_48 << ((byte)uVar9 & 0x1f) <= iVar8 &&
                               levelRoundingMode == ROUND_UP) + local_48;
              if (local_48 < 2) {
                local_48 = 1;
              }
              local_48 = local_48 + -1;
            }
            local_4c = (dataWindow->min).y;
            iVar3 = (dataWindow->max).y;
            iVar8 = iVar3 - local_4c;
            if (local_4c <= iVar3) {
              local_44 = (iVar8 + 1) / (1 << ((byte)uVar10 & 0x1f));
              local_44 = (uint)(local_44 << ((byte)uVar10 & 0x1f) <= iVar8 &&
                               levelRoundingMode == ROUND_UP) + local_44;
              if (local_44 < 2) {
                local_44 = 1;
              }
              local_44 = local_44 + -1;
            }
            local_48 = local_48 + local_50;
            local_44 = local_44 + local_4c;
            iVar3 = (*this->_vptr_Image[7])(this,uVar9 & 0xffffffff,uVar10 & 0xffffffff,&local_50);
            (this->_levels)._data[(this->_levels)._sizeY * uVar10 + uVar9] =
                 (ImageLevel *)CONCAT44(extraout_var,iVar3);
            p_Var7 = (this->_channels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            uVar5 = local_40;
            dataWindow = local_38;
            while (local_40 = uVar5, local_38 = dataWindow,
                  (_Rb_tree_header *)p_Var7 != &(this->_channels)._M_t._M_impl.super__Rb_tree_header
                  ) {
              pIVar2 = (this->_levels)._data[(this->_levels)._sizeY * uVar10 + uVar9];
              (*pIVar2->_vptr_ImageLevel[4])
                        (pIVar2,p_Var7 + 1,(ulong)p_Var7[2]._M_color,
                         (ulong)*(uint *)&p_Var7[2].field_0x4,(ulong)*(uint *)&p_Var7[2]._M_parent,
                         (ulong)*(byte *)((long)&p_Var7[2]._M_parent + 4));
              p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
              uVar5 = local_40;
              dataWindow = local_38;
            }
          }
          else {
            (this->_levels)._data[(this->_levels)._sizeY * uVar10 + uVar9] = (ImageLevel *)0x0;
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar5);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar4);
  }
  (this->_dataWindow).min = dataWindow->min;
  (this->_dataWindow).max = dataWindow->max;
  this->_levelMode = levelMode;
  this->_levelRoundingMode = levelRoundingMode;
  return;
}

Assistant:

void
Image::resize (
    const Box2i&      dataWindow,
    LevelMode         levelMode,
    LevelRoundingMode levelRoundingMode)
{
    try
    {
        clearLevels ();

        int nx = computeNumXLevels (dataWindow, levelMode, levelRoundingMode);
        int ny = computeNumYLevels (dataWindow, levelMode, levelRoundingMode);

        _levels.resizeErase (ny, nx);

        for (int y = 0; y < ny; ++y)
        {
            for (int x = 0; x < nx; ++x)
            {
                if (levelMode == MIPMAP_LEVELS && x != y)
                {
                    _levels[y][x] = 0;
                    continue;
                }

                Box2i levelDataWindow = computeDataWindowForLevel (
                    dataWindow, x, y, levelRoundingMode);

                _levels[y][x] = newLevel (x, y, levelDataWindow);

                for (ChannelMap::iterator i = _channels.begin ();
                     i != _channels.end ();
                     ++i)
                {
                    _levels[y][x]->insertChannel (
                        i->first,
                        i->second.type,
                        i->second.xSampling,
                        i->second.ySampling,
                        i->second.pLinear);
                }
            }
        }

        _dataWindow        = dataWindow;
        _levelMode         = levelMode;
        _levelRoundingMode = levelRoundingMode;
    }
    catch (...)
    {
        clearLevels ();
        throw;
    }
}